

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecayedException.h
# Opt level: O2

void __thiscall
libsgp4::DecayedException::DecayedException
          (DecayedException *this,DateTime *dt,Vector *pos,Vector *vel)

{
  std::runtime_error::runtime_error(&this->super_runtime_error,"Satellite decayed");
  *(undefined ***)this = &PTR__runtime_error_0010cd58;
  (this->_dt).m_encoded = dt->m_encoded;
  Vector::Vector(&this->_pos,pos);
  Vector::Vector(&this->_vel,vel);
  return;
}

Assistant:

DecayedException(const DateTime& dt, const Vector& pos, const Vector& vel)
        : runtime_error("Satellite decayed")
        , _dt(dt)
        , _pos(pos)
        , _vel(vel)
    {
    }